

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O3

bool __thiscall wasm::Analyzer::processExpressions(Analyzer *this)

{
  pointer ppEVar1;
  pointer ppEVar2;
  Expression *curr;
  undefined8 uVar3;
  undefined4 uVar4;
  pointer ppVar5;
  pointer pHVar6;
  pointer pNVar7;
  pointer ppVar8;
  pointer ppEVar9;
  Module *pMVar10;
  pointer ppVar11;
  pointer pNVar12;
  pointer ppVar13;
  StructField structField;
  undefined8 uStack_198;
  ReferenceFinder finder;
  
  ppEVar1 = (this->expressionQueue).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar2 = (this->expressionQueue).
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar2 != ppEVar1) {
    ppEVar9 = ppEVar2;
    do {
      curr = ppEVar9[-1];
      (this->expressionQueue).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppEVar9 + -1;
      uStack_198 = 0;
      finder.super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
      super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.replacep =
           (Expression **)0x0;
      memset((Expression ***)
             ((long)(finder.
                     super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                     .
                     super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                     .stack.fixed._M_elems + 9) + 8),0,0x88);
      finder.super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
      super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.currFunction
           = (Function *)this->module;
      Visitor<wasm::ReferenceFinder,_void>::visit
                ((Visitor<wasm::ReferenceFinder,_void> *)&uStack_198,curr);
      ppVar5 = finder.elements.
               super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (pMVar10 = finder.
                     super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                     .
                     super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                     .currModule;
          pHVar6 = finder.callRefTypes.
                   super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                   super__Vector_impl_data._M_start,
          ppVar11 = finder.elements.
                    super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage, pMVar10 != (Module *)ppVar5;
          pMVar10 = (Module *)&pMVar10->functions) {
        use(this,(ModuleElement)
                 (pMVar10->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data);
      }
      for (; pNVar7 = finder.refFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                      _M_impl.super__Vector_impl_data._M_start,
          pNVar12 = (pointer)finder.callRefTypes.
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
          ppVar11 != (pointer)pHVar6; ppVar11 = (pointer)&ppVar11->second) {
        useCallRefType(this,(HeapType)*(uintptr_t *)ppVar11);
      }
      for (; ppVar8 = finder.structFields.
                      super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
          ppVar13 = (pointer)finder.refFuncs.
                             super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage, pNVar12 != pNVar7;
          pNVar12 = pNVar12 + 1) {
        useRefFunc(this,(Name)(pNVar12->super_IString).str);
      }
      for (; ppVar13 != ppVar8; ppVar13 = ppVar13 + 1) {
        uVar3 = ppVar13->first;
        uVar4 = ppVar13->second;
        structField.second = uVar4;
        structField.first.id = uVar3;
        structField._12_4_ = 0;
        useStructField(this,structField);
      }
      scanChildren(this,curr);
      if (finder.refFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(finder.refFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (long)finder.structFields.
                              super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)finder.refFuncs.
                              super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      }
      if (finder.callRefTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(finder.callRefTypes.
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                        (long)finder.refFuncs.
                              super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)finder.callRefTypes.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (finder.elements.
          super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        operator_delete(finder.elements.
                        super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (long)finder.callRefTypes.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)finder.elements.
                              super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      if (finder.
          super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
          super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
          currModule != (Module *)0x0) {
        operator_delete(finder.
                        super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                        .
                        super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                        .currModule,
                        (long)finder.elements.
                              super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)finder.
                              super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                              .
                              super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                              .currModule);
      }
      if (finder.
          super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
          super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.stack.
          fixed._M_elems[9].currp != (Expression **)0x0) {
        operator_delete(finder.
                        super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                        .
                        super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                        .stack.fixed._M_elems[9].currp,
                        (long)finder.
                              super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                              .
                              super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                              .stack.flexible.
                              super__Vector_base<wasm::Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>::Task>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)finder.
                              super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                              .
                              super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                              .stack.fixed._M_elems[9].currp);
      }
      ppEVar9 = (this->expressionQueue).
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (ppEVar9 !=
             (this->expressionQueue).
             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  return ppEVar2 != ppEVar1;
}

Assistant:

bool processExpressions() {
    bool worked = false;
    while (expressionQueue.size()) {
      worked = true;

      auto* curr = expressionQueue.back();
      expressionQueue.pop_back();

      // Find references in this expression, and apply them. Anything found here
      // is used.
      ReferenceFinder finder;
      finder.setModule(module);
      finder.visit(curr);
      for (auto element : finder.elements) {
        use(element);
      }
      for (auto type : finder.callRefTypes) {
        useCallRefType(type);
      }
      for (auto func : finder.refFuncs) {
        useRefFunc(func);
      }
      for (auto structField : finder.structFields) {
        useStructField(structField);
      }

      // Scan the children to continue our work.
      scanChildren(curr);
    }
    return worked;
  }